

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_histogram.c
# Opt level: O0

REF_STATUS ref_histogram_add_stat(REF_HISTOGRAM ref_histogram,REF_DBL observation)

{
  double dVar1;
  double dVar2;
  REF_DBL log_obs;
  REF_INT i;
  REF_DBL observation_local;
  REF_HISTOGRAM ref_histogram_local;
  
  if (0.0 < observation) {
    dVar1 = log2(observation);
    for (log_obs._4_4_ = 0; log_obs._4_4_ < ref_histogram->nstat; log_obs._4_4_ = log_obs._4_4_ + 1)
    {
      dVar2 = pow(dVar1 - ref_histogram->log_mean,(double)log_obs._4_4_);
      ref_histogram->stats[log_obs._4_4_] = dVar2 + ref_histogram->stats[log_obs._4_4_];
    }
    ref_histogram_local._4_4_ = 0;
  }
  else {
    ref_histogram_local._4_4_ = 3;
  }
  return ref_histogram_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_histogram_add_stat(REF_HISTOGRAM ref_histogram,
                                          REF_DBL observation) {
  REF_INT i;
  REF_DBL log_obs;

  if (observation <= 0.0) return REF_INVALID;

  log_obs = log2(observation);

  for (i = 0; i < ref_histogram_nstat(ref_histogram); i++)
    ref_histogram_stat(ref_histogram, i) +=
        pow(log_obs - ref_histogram_log_mean(ref_histogram), i);

  return REF_SUCCESS;
}